

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O0

float __thiscall TPZMatrix<float>::operator()(TPZMatrix<float> *this,int64_t row,int64_t col)

{
  int64_t iVar1;
  long in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  float extraout_XMM0_Da;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  if (in_RSI < iVar1) {
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    if (((in_RDX < iVar1) && (-1 < in_RSI)) && (-1 < in_RDX)) goto LAB_012f72ae;
  }
  Error(in_stack_000001d0,in_stack_000001c8);
  pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
LAB_012f72ae:
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,in_RSI,in_RDX);
  return extraout_XMM0_Da;
}

Assistant:

inline TVar TPZMatrix<TVar>::operator()(const int64_t row, const int64_t col) const{
	// bound checking
#ifndef PZNODEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col<0 ) {
		Error("TPZMatrix<TVar>::Operator()","Index out of range");
        DebugStop();
	}
#endif
	return GetVal(row,col);
}